

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O0

void __thiscall Transporter::~Transporter(Transporter *this)

{
  bool bVar1;
  Transporter *this_local;
  
  this->_vptr_Transporter = (_func_int **)&PTR__Transporter_00267418;
  if (this->buf != (char *)0x0) {
    free(this->buf);
  }
  (*this->_vptr_Transporter[2])();
  bVar1 = std::thread::joinable(&this->thread);
  if (bVar1) {
    std::thread::join();
  }
  std::thread::~thread(&this->thread);
  return;
}

Assistant:

Transporter::~Transporter()
{
	if (buf)
	{
		free(buf);
	}
	Stop();
	if (thread.joinable())
		thread.join();
}